

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbedtls_wrapper.cpp
# Opt level: O0

bool duckdb_mbedtls::MbedTlsWrapper::IsValidSha256Signature
               (string *pubkey,string *signature,string *sha256_hash)

{
  int iVar1;
  long lVar2;
  runtime_error *prVar3;
  mbedtls_md_type_t extraout_var;
  size_t sig_len;
  uchar *sig;
  size_t hash_len;
  bool valid;
  mbedtls_pk_context pk_context;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  uchar *in_stack_ffffffffffffff00;
  mbedtls_md_type_t md_alg;
  mbedtls_pk_context *in_stack_ffffffffffffff10;
  mbedtls_pk_info_t *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  size_t in_stack_ffffffffffffff48;
  uchar *in_stack_ffffffffffffff50;
  mbedtls_pk_context *in_stack_ffffffffffffff58;
  string local_38 [56];
  
  lVar2 = std::__cxx11::string::size();
  if (lVar2 == 0x100) {
    lVar2 = std::__cxx11::string::size();
    if (lVar2 == 0x20) {
      mbedtls_pk_init((mbedtls_pk_context *)&stack0xffffffffffffff20);
      std::__cxx11::string::c_str();
      md_alg = extraout_var;
      std::__cxx11::string::size();
      iVar1 = mbedtls_pk_parse_public_key
                        (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                         in_stack_ffffffffffffff48);
      if (iVar1 != 0) {
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar3,"RSA public key import error");
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      sig_len = std::__cxx11::string::data();
      sig = (uchar *)std::__cxx11::string::size();
      hash_len = std::__cxx11::string::data();
      std::__cxx11::string::length();
      iVar1 = mbedtls_pk_verify(in_stack_ffffffffffffff10,md_alg,in_stack_ffffffffffffff00,hash_len,
                                sig,sig_len);
      mbedtls_pk_free((mbedtls_pk_context *)0x85cdd3);
      return iVar1 == 0;
    }
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::size();
  std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffff28);
  std::operator+((char *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  std::operator+(in_stack_fffffffffffffef8,(char *)in_stack_fffffffffffffef0);
  std::__cxx11::string::size();
  std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffff28);
  std::operator+(in_stack_ffffffffffffff28,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff20);
  std::runtime_error::runtime_error(prVar3,local_38);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool MbedTlsWrapper::IsValidSha256Signature(const std::string &pubkey, const std::string &signature,
                                            const std::string &sha256_hash) {

	if (signature.size() != 256 || sha256_hash.size() != 32) {
		throw std::runtime_error("Invalid input lengths, expected signature length 256, got " +
		                         to_string(signature.size()) + ", hash length 32, got " +
		                         to_string(sha256_hash.size()));
	}

	mbedtls_pk_context pk_context;
	mbedtls_pk_init(&pk_context);

	if (mbedtls_pk_parse_public_key(&pk_context, reinterpret_cast<const unsigned char *>(pubkey.c_str()),
	                                pubkey.size() + 1)) {
		throw runtime_error("RSA public key import error");
	}

	// actually verify
	bool valid = mbedtls_pk_verify(&pk_context, MBEDTLS_MD_SHA256,
	                               reinterpret_cast<const unsigned char *>(sha256_hash.data()), sha256_hash.size(),
	                               reinterpret_cast<const unsigned char *>(signature.data()), signature.length()) == 0;

	mbedtls_pk_free(&pk_context);
	return valid;
}